

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

bool __thiscall
TFileNameDatabase::CompareAndCopyPathFragment(TFileNameDatabase *this,TMndxSearch *pSearch)

{
  byte NewItem;
  TStruct40 *pTVar1;
  _HASH_ENTRY *p_Var2;
  bool bVar3;
  uint uVar4;
  DWORD DVar5;
  DWORD TableIndex;
  char *__function;
  uint uVar6;
  DWORD HiBitsIndex;
  DWORD local_3c;
  TPathFragmentTable *local_38;
  
  pTVar1 = pSearch->pStruct40;
  DVar5 = pTVar1->NodeIndex;
  uVar4 = (DVar5 << 5 ^ DVar5 ^ (uint)(byte)pSearch->szSearchMask[pTVar1->PathLength]) &
          this->HashTableMask;
  if ((this->HashTable).ItemCount <= uVar4) {
    __function = "T &TGenericArray<_HASH_ENTRY>::operator[](size_t) [T = _HASH_ENTRY]";
LAB_00116930:
    __assert_fail("index < ItemCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                  ,0x1d0,__function);
  }
  p_Var2 = (this->HashTable).ItemArray;
  if (DVar5 == p_Var2[uVar4].NodeIndex) {
    uVar6 = p_Var2[uVar4].field_2.FragmentOffset;
    if (uVar6 >> 8 < 0xffffff) {
      if (this->pChildDB == (TFileNameDatabase *)0x0) {
        bVar3 = TPathFragmentTable::CompareAndCopyPathFragment
                          (&this->PathFragmentTable,pSearch,(ulong)uVar6);
      }
      else {
        bVar3 = CompareAndCopyPathFragmentByIndex(this->pChildDB,pSearch,uVar6);
      }
      if (bVar3 == false) goto LAB_001168e1;
    }
    else {
      TGenericArray<char>::Insert(&pTVar1->PathBuffer,(char)uVar6);
      pTVar1->PathLength = pTVar1->PathLength + 1;
    }
    pTVar1->NodeIndex = p_Var2[uVar4].NextIndex;
LAB_001168dd:
    bVar3 = true;
  }
  else {
    DVar5 = TSparseArray::GetItem0(&this->CollisionTable,DVar5);
    pTVar1->NodeIndex = DVar5 - pTVar1->NodeIndex;
    local_3c = 0xffffffff;
    bVar3 = TSparseArray::IsItemPresent(&this->CollisionTable,(ulong)(DVar5 + 1));
    if (bVar3) {
      local_38 = &this->PathFragmentTable;
      uVar4 = DVar5 + 2;
      do {
        bVar3 = TSparseArray::IsItemPresent(&this->CollisionHiBitsIndexes,(ulong)pTVar1->NodeIndex);
        uVar6 = pTVar1->NodeIndex;
        if (bVar3) {
          TableIndex = GetPathFragmentOffset2(this,&local_3c,uVar6);
          DVar5 = pTVar1->PathLength;
          if (this->pChildDB == (TFileNameDatabase *)0x0) {
            bVar3 = TPathFragmentTable::CompareAndCopyPathFragment
                              (local_38,pSearch,(ulong)TableIndex);
          }
          else {
            bVar3 = CompareAndCopyPathFragmentByIndex(this->pChildDB,pSearch,TableIndex);
          }
          if (bVar3 != false) goto LAB_001168dd;
          if (DVar5 != pTVar1->PathLength) break;
          uVar6 = pTVar1->NodeIndex;
        }
        else {
          if ((this->LoBitsTable).ItemCount <= uVar6) {
            __function = "T &TGenericArray<unsigned char>::operator[](size_t) [T = unsigned char]";
            goto LAB_00116930;
          }
          NewItem = (this->LoBitsTable).ItemArray[uVar6];
          if ((uint)NewItem == (int)pSearch->szSearchMask[pTVar1->PathLength]) {
            TGenericArray<char>::Insert(&pTVar1->PathBuffer,NewItem);
            pTVar1->PathLength = pTVar1->PathLength + 1;
            goto LAB_001168dd;
          }
        }
        pTVar1->NodeIndex = uVar6 + 1;
        bVar3 = TSparseArray::IsItemPresent(&this->CollisionTable,(ulong)uVar4);
        uVar4 = uVar4 + 1;
      } while (bVar3);
    }
LAB_001168e1:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CompareAndCopyPathFragment(TMndxSearch * pSearch)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;
        PHASH_ENTRY pHashEntry;
        DWORD HiBitsIndex;
        DWORD ColTableIndex;
        DWORD TableIndex;
/*
        FILE * fp = fopen("E:\\PathFragmentTable.txt", "wt");
        if (fp != NULL)
        {
            for (DWORD i = 0; i < HashTable.ItemCount; i++)
            {
                FragOffs = HashTable[i].FragOffs;
                fprintf(fp, "%02x ('%c') %08X %08X %08X", i, (0x20 <= i && i < 0x80) ? i : 0x20, HashTable[i].ItemIndex, HashTable[i].NextIndex, FragOffs);

                if(FragOffs != 0x00800000)
                {
                    if((FragOffs & 0xFFFFFF00) == 0xFFFFFF00)
                        fprintf(fp, " '%c'", (char)(FragOffs & 0xFF));
                    else
                        fprintf(fp, " %s", &PathFragmentTable.PathFragments[FragOffs]);
                }
                fprintf(fp, "\n");
            }

            fclose(fp);
        }
*/
        // Calculate the item hash from the current char and fragment ID
        TableIndex = pStruct40->CalcHashValue(pSearch->szSearchMask) & HashTableMask;
        pHashEntry = &HashTable[TableIndex];

        // Does the hash value ID match?
        if(pStruct40->NodeIndex == pHashEntry->NodeIndex)
        {
            // If the higher 24 bits are set, then the fragment is just one letter,
            // contained directly in the table.
            if(!IsPathFragmentSingleChar(pHashEntry))
            {
                // HOTS: 1958B59
                if (pChildDB != NULL)
                {
                    if (!pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, pHashEntry->ChildTableIndex))
                        return false;
                }
                else
                {
                    if (!PathFragmentTable.CompareAndCopyPathFragment(pSearch, pHashEntry->FragmentOffset))
                        return false;
                }
            }
            else
            {
                // HOTS: 1958B88
                pStruct40->PathBuffer.Insert(pHashEntry->SingleChar);
                pStruct40->PathLength++;
            }

            // HOTS: 1958BCA
            pStruct40->NodeIndex = pHashEntry->NextIndex;
            return true;
        }

        // HOTS: 1958BE5
        ColTableIndex = CollisionTable.GetItem0(pStruct40->NodeIndex) + 1;
        pStruct40->NodeIndex = (ColTableIndex - pStruct40->NodeIndex - 1);
        HiBitsIndex = CASC_INVALID_INDEX;

        // Keep searching while we have a valid collision table entry
        while(CollisionTable.IsItemPresent(ColTableIndex))
        {
            // If we have high bits in the the bit at NodeIndex is set, it means that there is fragment offset
            // If not, the byte in LoBitsTable is the character
            if(IsPathFragmentString(pStruct40->NodeIndex))
            {
                DWORD FragmentOffset = GetPathFragmentOffset2(HiBitsIndex, pStruct40->NodeIndex);
                DWORD SavePathLength = pStruct40->PathLength;   // HOTS: 1958C62

                // Do we have a child database?
                if(pChildDB != NULL)
                {
                    // HOTS: 1958CCB
                    if(pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, FragmentOffset))
                        return true;
                }
                else
                {
                    // HOTS: 1958CD6
                    if(PathFragmentTable.CompareAndCopyPathFragment(pSearch, FragmentOffset))
                        return true;
                }

                // HOTS: 1958CED
                if(SavePathLength != pStruct40->PathLength)
                    return false;
            }
            else
            {
                // HOTS: 1958CFB
                if(LoBitsTable[pStruct40->NodeIndex] == pSearch->szSearchMask[pStruct40->PathLength])
                {
                    // HOTS: 1958D11
                    pStruct40->PathBuffer.Insert(LoBitsTable[pStruct40->NodeIndex]);
                    pStruct40->PathLength++;
                    return true;
                }
            }

            // HOTS: 1958D11
            pStruct40->NodeIndex++;
            ColTableIndex++;
        }

        return false;
    }